

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3StreamReader.h
# Opt level: O1

void __thiscall AC3StreamReader::~AC3StreamReader(AC3StreamReader *this)

{
  pointer puVar1;
  
  puVar1 = (this->m_delayedAc3Buffer).m_data.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_delayedAc3Buffer).m_data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  SimplePacketizerReader::~SimplePacketizerReader(&this->super_SimplePacketizerReader);
  return;
}

Assistant:

AC3StreamReader() : m_useNewStyleAudioPES(false)
    {
        m_downconvertToAC3 = m_true_hd_mode = false;
        m_state = AC3State::stateDecodeAC3;
        m_waitMoreData = false;

        m_thdDemuxWaitAc3 = true;  // wait ac3 packet
        m_demuxedTHDSamples = 0;
        m_totalTHDSamples = 0;
        m_nextAc3Time = 0;
    }